

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  size_t *psVar1;
  pointer *this;
  bool bVar2;
  byte bVar3;
  cmLocalGenerator *this_00;
  char *__s;
  string *psVar4;
  Value *pVVar5;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__x;
  reference ppcVar6;
  cmGeneratorTarget *pcVar7;
  ulong uVar8;
  cmMakefile *pcVar9;
  reference __k;
  mapped_type *this_01;
  reference dir;
  cmOutputConverter *local_bb8;
  cmInstallTargetGenerator *local_b60;
  Value local_ac0;
  undefined1 local_a98 [8];
  Value sourceGroupsValue;
  string *i;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includePathList;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  LanguageData *ld;
  string *lang;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  allocator<char> local_949;
  string local_948;
  undefined1 local_928 [8];
  string sysroot;
  Value local_8e0;
  Value local_8b8;
  string local_890;
  Value local_870;
  string local_848;
  Value local_828;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  cmStateSnapshot local_740;
  cmStateDirectory local_728;
  undefined1 local_700 [8];
  cmLinkLineComputer linkLineComputer;
  string linkPath;
  string frameworkPath;
  string linkLanguageFlags;
  string linkFlags;
  string linkLibs;
  Value local_600;
  Value local_5d8;
  string local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  Value local_550;
  OutputInfo *local_528;
  OutputInfo *output;
  Value local_500;
  string local_4d8;
  Value local_4b8;
  undefined1 local_490 [8];
  Value artifacts;
  Value local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  undefined1 local_3b0 [8];
  string installPrefix;
  string installPath;
  string dest;
  cmInstallTargetGenerator *installTargetGenerator;
  cmInstallGenerator *installGenerator;
  iterator __end2;
  iterator __begin2;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range2;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> targetGenerators;
  Value installPaths;
  string local_2c0;
  Value local_2a0;
  Value local_278;
  Value local_250;
  Value local_228;
  Value local_200;
  Value local_1d8;
  byte local_1ad;
  undefined4 local_1ac;
  Value local_1a8;
  Value local_180;
  Value local_158;
  Value local_130;
  Value local_108;
  Value local_e0;
  Value local_b8;
  undefined1 local_90 [8];
  Value ttl;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string typeName;
  TargetType type;
  cmLocalGenerator *lg;
  string *config_local;
  cmGeneratorTarget *target_local;
  Value *result;
  
  this_00 = cmGeneratorTarget::GetLocalGenerator(target);
  typeName.field_2._12_4_ = cmGeneratorTarget::GetType(target);
  __s = cmState::GetTargetTypeName(typeName.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_51);
  std::allocator<char>::~allocator(&local_51);
  Json::Value::Value((Value *)local_90,arrayValue);
  Json::Value::Value(&local_b8,"EXECUTABLE");
  Json::Value::append((Value *)local_90,&local_b8);
  Json::Value::~Value(&local_b8);
  Json::Value::Value(&local_e0,"STATIC_LIBRARY");
  Json::Value::append((Value *)local_90,&local_e0);
  Json::Value::~Value(&local_e0);
  Json::Value::Value(&local_108,"SHARED_LIBRARY");
  Json::Value::append((Value *)local_90,&local_108);
  Json::Value::~Value(&local_108);
  Json::Value::Value(&local_130,"MODULE_LIBRARY");
  Json::Value::append((Value *)local_90,&local_130);
  Json::Value::~Value(&local_130);
  Json::Value::Value(&local_158,"OBJECT_LIBRARY");
  Json::Value::append((Value *)local_90,&local_158);
  Json::Value::~Value(&local_158);
  Json::Value::Value(&local_180,"UTILITY");
  Json::Value::append((Value *)local_90,&local_180);
  Json::Value::~Value(&local_180);
  Json::Value::Value(&local_1a8,"INTERFACE_LIBRARY");
  Json::Value::append((Value *)local_90,&local_1a8);
  Json::Value::~Value(&local_1a8);
  bVar2 = anon_unknown.dwarf_d44993::hasString((Value *)local_90,(string *)local_50);
  if ((!bVar2) || (bVar2 = cmGeneratorTarget::IsImported(target), bVar2)) {
    Json::Value::Value(__return_storage_ptr__,nullValue);
    local_1ac = 1;
  }
  else {
    local_1ad = 0;
    Json::Value::Value(__return_storage_ptr__,objectValue);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value(&local_1d8,psVar4);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_1d8);
    Json::Value::~Value(&local_1d8);
    bVar2 = cmTarget::GetIsGeneratorProvided(target->Target);
    Json::Value::Value(&local_200,bVar2);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kIS_GENERATOR_PROVIDED_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_200);
    Json::Value::~Value(&local_200);
    Json::Value::Value(&local_228,(string *)local_50);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_228);
    Json::Value::~Value(&local_228);
    psVar4 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    Json::Value::Value(&local_250,psVar4);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_250);
    Json::Value::~Value(&local_250);
    psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    Json::Value::Value(&local_278,psVar4);
    pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar5,&local_278);
    Json::Value::~Value(&local_278);
    if (typeName.field_2._12_4_ == 7) {
      local_1ad = 1;
      local_1ac = 1;
    }
    else {
      cmGeneratorTarget::GetFullName(&local_2c0,target,config,RuntimeBinaryArtifact);
      Json::Value::Value(&local_2a0,&local_2c0);
      pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar5,&local_2a0);
      Json::Value::~Value(&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      bVar2 = cmTarget::GetHaveInstallRule(target->Target);
      if (bVar2) {
        Json::Value::Value((Value *)&installPaths.limit_,true);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kHAS_INSTALL_RULE_abi_cxx11_);
        Json::Value::operator=(pVVar5,(Value *)&installPaths.limit_);
        Json::Value::~Value((Value *)&installPaths.limit_);
        Json::Value::Value((Value *)&targetGenerators.
                                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
        __x = cmMakefile::GetInstallGenerators(target->Makefile);
        std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
                  ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)&__range2,
                   __x);
        __end2 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                           ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                            &__range2);
        installGenerator =
             (cmInstallGenerator *)
             std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                       ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                        &__range2);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                                           *)&installGenerator), bVar2) {
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                    ::operator*(&__end2);
          if (*ppcVar6 == (cmInstallGenerator *)0x0) {
            local_b60 = (cmInstallTargetGenerator *)0x0;
          }
          else {
            local_b60 = (cmInstallTargetGenerator *)
                        __dynamic_cast(*ppcVar6,&cmInstallGenerator::typeinfo,
                                       &cmInstallTargetGenerator::typeinfo,0);
          }
          if ((local_b60 != (cmInstallTargetGenerator *)0x0) &&
             (pcVar7 = cmInstallTargetGenerator::GetTarget(local_b60),
             pcVar7->Target == target->Target)) {
            cmInstallTargetGenerator::GetDestination
                      ((string *)((long)&installPath.field_2 + 8),local_b60,config);
            std::__cxx11::string::string((string *)(installPrefix.field_2._M_local_buf + 8));
            uVar8 = std::__cxx11::string::empty();
            if (((uVar8 & 1) == 0) &&
               (bVar2 = cmsys::SystemTools::FileIsFullPath
                                  ((string *)((long)&installPath.field_2 + 8)), bVar2)) {
              std::__cxx11::string::operator=
                        ((string *)(installPrefix.field_2._M_local_buf + 8),
                         (string *)(installPath.field_2._M_local_buf + 8));
            }
            else {
              pcVar9 = target->Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3d0,"CMAKE_INSTALL_PREFIX",&local_3d1);
              psVar4 = cmMakefile::GetSafeDefinition(pcVar9,&local_3d0);
              std::__cxx11::string::string((string *)local_3b0,(string *)psVar4);
              std::__cxx11::string::~string((string *)&local_3d0);
              std::allocator<char>::~allocator(&local_3d1);
              std::operator+(&local_418,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3b0,'/');
              std::operator+(&local_3f8,&local_418,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&installPath.field_2 + 8));
              std::__cxx11::string::operator=
                        ((string *)(installPrefix.field_2._M_local_buf + 8),(string *)&local_3f8);
              std::__cxx11::string::~string((string *)&local_3f8);
              std::__cxx11::string::~string((string *)&local_418);
              std::__cxx11::string::~string((string *)local_3b0);
            }
            Json::Value::Value(&local_440,(string *)((long)&installPrefix.field_2 + 8));
            Json::Value::append((Value *)&targetGenerators.
                                          super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_440);
            Json::Value::~Value(&local_440);
            std::__cxx11::string::~string((string *)(installPrefix.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(installPath.field_2._M_local_buf + 8));
          }
          __gnu_cxx::
          __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
          ::operator++(&__end2);
        }
        Json::Value::Value((Value *)&artifacts.limit_,
                           (Value *)&targetGenerators.
                                     super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kINSTALL_PATHS_abi_cxx11_);
        Json::Value::operator=(pVVar5,(Value *)&artifacts.limit_);
        Json::Value::~Value((Value *)&artifacts.limit_);
        std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::~vector
                  ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)&__range2)
        ;
        Json::Value::~Value((Value *)&targetGenerators.
                                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      bVar2 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
      if (bVar2) {
        Json::Value::Value((Value *)local_490,arrayValue);
        cmGeneratorTarget::GetFullPath(&local_4d8,target,config,RuntimeBinaryArtifact,false);
        Json::Value::Value(&local_4b8,&local_4d8);
        Json::Value::append((Value *)local_490,&local_4b8);
        Json::Value::~Value(&local_4b8);
        std::__cxx11::string::~string((string *)&local_4d8);
        bVar2 = cmGeneratorTarget::IsDLLPlatform(target);
        if (bVar2) {
          cmGeneratorTarget::GetFullPath
                    ((string *)&output,target,config,ImportLibraryArtifact,false);
          Json::Value::Value(&local_500,(string *)&output);
          Json::Value::append((Value *)local_490,&local_500);
          Json::Value::~Value(&local_500);
          std::__cxx11::string::~string((string *)&output);
          local_528 = cmGeneratorTarget::GetOutputInfo(target,config);
          if ((local_528 != (OutputInfo *)0x0) &&
             (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
            std::operator+(&local_590,&local_528->PdbDir,'/');
            cmGeneratorTarget::GetPDBName(&local_5b0,target,config);
            std::operator+(&local_570,&local_590,&local_5b0);
            Json::Value::Value(&local_550,&local_570);
            Json::Value::append((Value *)local_490,&local_550);
            Json::Value::~Value(&local_550);
            std::__cxx11::string::~string((string *)&local_570);
            std::__cxx11::string::~string((string *)&local_5b0);
            std::__cxx11::string::~string((string *)&local_590);
          }
        }
        Json::Value::Value(&local_5d8,(Value *)local_490);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_5d8);
        Json::Value::~Value(&local_5d8);
        cmGeneratorTarget::GetLinkerLanguage((string *)((long)&linkLibs.field_2 + 8),target,config);
        Json::Value::Value(&local_600,(string *)((long)&linkLibs.field_2 + 8));
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_600);
        Json::Value::~Value(&local_600);
        std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(linkLanguageFlags.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&linkLineComputer.ForResponse);
        local_bb8 = (cmOutputConverter *)0x0;
        if (this_00 != (cmLocalGenerator *)0x0) {
          local_bb8 = &this_00->super_cmOutputConverter;
        }
        cmLocalGenerator::GetStateSnapshot(&local_740,this_00);
        cmStateSnapshot::GetDirectory(&local_728,&local_740);
        cmLinkLineComputer::cmLinkLineComputer((cmLinkLineComputer *)local_700,local_bb8,&local_728)
        ;
        cmLocalGenerator::GetTargetFlags
                  (this_00,(cmLinkLineComputer *)local_700,config,
                   (string *)((long)&linkFlags.field_2 + 8),
                   (string *)((long)&frameworkPath.field_2 + 8),
                   (string *)((long)&linkLanguageFlags.field_2 + 8),
                   (string *)((long)&linkPath.field_2 + 8),(string *)&linkLineComputer.ForResponse,
                   target);
        cmSystemTools::TrimWhitespace(&local_760,(string *)((long)&linkFlags.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(linkFlags.field_2._M_local_buf + 8),(string *)&local_760);
        std::__cxx11::string::~string((string *)&local_760);
        cmSystemTools::TrimWhitespace(&local_780,(string *)((long)&linkLanguageFlags.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(linkLanguageFlags.field_2._M_local_buf + 8),(string *)&local_780);
        std::__cxx11::string::~string((string *)&local_780);
        cmSystemTools::TrimWhitespace(&local_7a0,(string *)((long)&frameworkPath.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
        cmSystemTools::TrimWhitespace(&local_7c0,(string *)((long)&linkPath.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(linkPath.field_2._M_local_buf + 8),(string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        cmSystemTools::TrimWhitespace(&local_7e0,(string *)&linkLineComputer.ForResponse);
        std::__cxx11::string::operator=
                  ((string *)&linkLineComputer.ForResponse,(string *)&local_7e0);
        std::__cxx11::string::~string((string *)&local_7e0);
        cmSystemTools::TrimWhitespace(&local_800,(string *)((long)&linkFlags.field_2 + 8));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_800);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          Json::Value::Value(&local_828,(string *)((long)&linkFlags.field_2 + 8));
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_828);
          Json::Value::~Value(&local_828);
        }
        cmSystemTools::TrimWhitespace(&local_848,(string *)((long)&linkLanguageFlags.field_2 + 8));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_848);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          Json::Value::Value(&local_870,(string *)((long)&linkLanguageFlags.field_2 + 8));
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_870);
          Json::Value::~Value(&local_870);
        }
        cmSystemTools::TrimWhitespace(&local_890,(string *)((long)&frameworkPath.field_2 + 8));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_890);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          Json::Value::Value(&local_8b8,(string *)((long)&frameworkPath.field_2 + 8));
          pVVar5 = Json::Value::operator[]
                             (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_8b8);
          Json::Value::~Value(&local_8b8);
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          Json::Value::Value(&local_8e0,(string *)((long)&linkPath.field_2 + 8));
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,&local_8e0);
          Json::Value::~Value(&local_8e0);
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          Json::Value::Value((Value *)((long)&sysroot.field_2 + 8),
                             (string *)&linkLineComputer.ForResponse);
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar5,(Value *)((long)&sysroot.field_2 + 8));
          Json::Value::~Value((Value *)((long)&sysroot.field_2 + 8));
        }
        pcVar9 = cmLocalGenerator::GetMakefile(this_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_948,"CMAKE_SYSROOT",&local_949);
        psVar4 = cmMakefile::GetSafeDefinition(pcVar9,&local_948);
        std::__cxx11::string::string((string *)local_928,(string *)psVar4);
        std::__cxx11::string::~string((string *)&local_948);
        std::allocator<char>::~allocator(&local_949);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          Json::Value::Value((Value *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (string *)local_928);
          pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
          Json::Value::operator=
                    (pVVar5,(Value *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
          Json::Value::~Value((Value *)&languages._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        std::__cxx11::string::~string((string *)local_928);
        cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)local_700);
        std::__cxx11::string::~string((string *)&linkLineComputer.ForResponse);
        std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(linkLanguageFlags.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
        Json::Value::~Value((Value *)local_490);
      }
      psVar1 = &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar1);
      cmGeneratorTarget::GetLanguages
                (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)psVar1,config);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
             *)&__range1);
      psVar1 = &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)psVar1);
      lang = (string *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&lang), bVar2) {
        __k = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&__end1);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                                *)&__range1,__k);
        std::__cxx11::string::operator=((string *)&this_01->Language,(string *)__k);
        cmLocalGenerator::GetTargetCompileFlags(this_00,target,config,__k,&this_01->Flags);
        this = &includePathList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
        cmLocalGenerator::GetTargetDefines
                  (this_00,target,config,__k,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
        LanguageData::SetDefines
                  (this_01,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&includePathList.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2_1);
        cmLocalGenerator::GetIncludeDirectories
                  (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2_1,target,__k,config);
        __end2_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2_1);
        i = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2_1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&i), bVar2) {
          dir = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2_1);
          sourceGroupsValue.limit_._7_1_ =
               cmGeneratorTarget::IsSystemIncludeDirectory(target,dir,config,__k);
          std::
          vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
          ::emplace_back<std::__cxx11::string_const&,bool>
                    ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                      *)&this_01->IncludePathList,dir,(bool *)((long)&sourceGroupsValue.limit_ + 7))
          ;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2_1);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includePathList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      DumpSourceFilesList((Value *)local_a98,target,config,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                           *)&__range1);
      bVar2 = Json::Value::empty((Value *)local_a98);
      if (!bVar2) {
        Json::Value::Value(&local_ac0,(Value *)local_a98);
        pVVar5 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar5,&local_ac0);
        Json::Value::~Value(&local_ac0);
      }
      local_1ad = 1;
      local_1ac = 1;
      Json::Value::~Value((Value *)local_a98);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
              *)&__range1);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    if ((local_1ad & 1) == 0) {
      Json::Value::~Value(__return_storage_ptr__);
    }
  }
  Json::Value::~Value((Value *)local_90);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = cmState::GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kIS_GENERATOR_PROVIDED_KEY] =
    target->Target->GetIsGeneratorProvided();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  if (target->Target->GetHaveInstallRule()) {
    result[kHAS_INSTALL_RULE] = true;

    Json::Value installPaths = Json::arrayValue;
    auto targetGenerators = target->Makefile->GetInstallGenerators();
    for (auto installGenerator : targetGenerators) {
      auto installTargetGenerator =
        dynamic_cast<cmInstallTargetGenerator*>(installGenerator);
      if (installTargetGenerator != nullptr &&
          installTargetGenerator->GetTarget()->Target == target->Target) {
        auto dest = installTargetGenerator->GetDestination(config);

        std::string installPath;
        if (!dest.empty() && cmSystemTools::FileIsFullPath(dest)) {
          installPath = dest;
        } else {
          std::string installPrefix =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
          installPath = installPrefix + '/' + dest;
        }

        installPaths.append(installPath);
      }
    }

    result[kINSTALL_PATHS] = installPaths;
  }

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;

  for (std::string const& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config);
    for (std::string const& i : includePathList) {
      ld.IncludePathList.emplace_back(
        i, target->IsSystemIncludeDirectory(i, config, lang));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}